

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_pivot_stmt.cpp
# Opt level: O2

unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> __thiscall
duckdb::Transformer::TransformPivotStatement(Transformer *this,PGSelectStmt *select)

{
  PGPivotStmt *pPVar1;
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var2;
  PGList *pPVar3;
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var4;
  _Head_base<0UL,_duckdb::SelectNode_*,_false> _Var5;
  undefined1 auVar6 [8];
  pointer pbVar7;
  idx_t iVar8;
  idx_t iVar9;
  PGWithClause *de_with_clause;
  pointer pSVar10;
  reference this_00;
  pointer pTVar11;
  reference this_01;
  pointer pPVar12;
  pointer pPVar13;
  reference args;
  pointer pCVar14;
  type ref;
  type pSVar15;
  InternalException *this_02;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> *column;
  PGSelectStmt *in_RDX;
  ulong __n;
  bool is_pivot;
  hugeint_t hVar16;
  hugeint_t input;
  _Head_base<0UL,_duckdb::TableRef_*,_false> local_120;
  _Head_base<0UL,_duckdb::SelectNode_*,_false> local_118;
  Transformer *local_110;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_108;
  undefined1 local_100 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  groups;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> local_d0;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_c8;
  _Head_base<0UL,_duckdb::SelectNode_*,_false> local_c0;
  GroupingSet set;
  vector<duckdb::PivotColumn,_true> columns;
  string local_50;
  
  pPVar1 = in_RDX->pivot;
  iVar8 = ParamCount((Transformer *)select);
  TransformTableRefNode((Transformer *)local_100,(PGNode *)select);
  local_110 = (Transformer *)select;
  iVar9 = ParamCount((Transformer *)select);
  make_uniq<duckdb::SelectNode>();
  if (in_RDX->withClause != (PGWithClause *)0x0) {
    set._M_t._M_impl._0_8_ = in_RDX->withClause;
    de_with_clause =
         optional_ptr<duckdb_libpgquery::PGWithClause,_true>::operator*
                   ((optional_ptr<duckdb_libpgquery::PGWithClause,_true> *)&set);
    pSVar10 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
              operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                          *)&local_118);
    TransformCTE(local_110,de_with_clause,&(pSVar10->super_QueryNode).cte_map);
  }
  if (pPVar1->columns == (PGList *)0x0) {
    pSVar10 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
              operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                          *)&local_118);
    auVar6 = local_100;
    local_100 = (undefined1  [8])0x0;
    _Var2._M_head_impl =
         (pSVar10->from_table).
         super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
         super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
         super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
    (pSVar10->from_table).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>
    ._M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
    super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = (TableRef *)auVar6;
    if (_Var2._M_head_impl != (TableRef *)0x0) {
      (**(code **)((long)(_Var2._M_head_impl)->_vptr_TableRef + 8))();
    }
    if (pPVar1->groups != (PGList *)0x0) {
      TransformStringList_abi_cxx11_(&groups,local_110,pPVar1->groups);
      set._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &set._M_t._M_impl.super__Rb_tree_header._M_header;
      set._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           set._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
      set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      set._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      set._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           set._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      for (columns.super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>.
           super__Vector_base<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>._M_impl.
           super__Vector_impl_data._M_start = (pointer)0x0;
          columns.super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>.
          super__Vector_base<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>._M_impl.
          super__Vector_impl_data._M_start <
          (pointer)((long)groups.
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)groups.
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5);
          columns.super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>.
          super__Vector_base<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)((long)&((columns.
                                  super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>
                                  .
                                  super__Vector_base<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->pivot_expressions).
                                super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                .
                                super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + 1)) {
        args = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::get<true>(&groups,(size_type)
                                   columns.
                                   super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>
                                   .
                                   super__Vector_base<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
        make_uniq<duckdb::ColumnRefExpression,std::__cxx11::string&>((duckdb *)&local_120,args);
        pSVar10 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
                  operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                              *)&local_118);
        pCVar14 = unique_ptr<duckdb::ColumnRefExpression,_std::default_delete<duckdb::ColumnRefExpression>,_true>
                  ::operator->((unique_ptr<duckdb::ColumnRefExpression,_std::default_delete<duckdb::ColumnRefExpression>,_true>
                                *)&local_120);
        (*(pCVar14->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression[0xc])
                  (&local_108,pCVar14);
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                    *)&pSVar10->select_list,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)&local_108);
        if ((TableRef *)local_108._M_head_impl != (TableRef *)0x0) {
          (*((local_108._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
        pSVar10 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
                  operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                              *)&local_118);
        local_108._M_head_impl = (ParsedExpression *)local_120._M_head_impl;
        local_120._M_head_impl = (TableRef *)0x0;
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                    *)&pSVar10->groups,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)&local_108);
        if ((TableRef *)local_108._M_head_impl != (TableRef *)0x0) {
          (*((local_108._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
        ::std::
        _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
        ::_M_insert_unique<unsigned_long_const&>
                  ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                    *)&set,(unsigned_long *)&columns);
        if (local_120._M_head_impl != (TableRef *)0x0) {
          (*(local_120._M_head_impl)->_vptr_TableRef[1])();
        }
      }
      pSVar10 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
                operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                            *)&local_118);
      ::std::
      vector<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>,std::allocator<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>>
      ::emplace_back<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>
                ((vector<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>,std::allocator<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>>
                  *)&(pSVar10->groups).grouping_sets,&set);
      ::std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::~_Rb_tree(&set._M_t);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&groups);
    }
    pPVar3 = pPVar1->aggrs;
    if (pPVar3 != (PGList *)0x0) {
      pSVar10 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
                operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                            *)&local_118);
      TransformExpressionList(local_110,pPVar3,&pSVar10->select_list);
    }
    pSVar15 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
              operator*((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                         *)&local_118);
    TransformModifiers(local_110,in_RDX,&pSVar15->super_QueryNode);
    (this->parent).ptr = (Transformer *)local_118._M_head_impl;
  }
  else {
    is_pivot = pPVar1->unpivots == (PGList *)0x0;
    column = (_Head_base<0UL,_duckdb::ParsedExpression_*,_false> *)(ulong)is_pivot;
    TransformPivotList(&columns,local_110,pPVar1->columns,is_pivot);
    for (__n = 0; __n < (ulong)(((long)columns.
                                       super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>
                                       .
                                       super__Vector_base<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)columns.
                                      super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>
                                      .
                                      super__Vector_base<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>
                                      ._M_impl.super__Vector_impl_data._M_start) / 0x70);
        __n = __n + 1) {
      this_00 = vector<duckdb::PivotColumn,_true>::get<true>(&columns,__n);
      if (((this_00->pivot_enum)._M_string_length == 0) &&
         ((this_00->entries).
          super_vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
          super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          (this_00->entries).
          super_vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
          super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
          _M_impl.super__Vector_impl_data._M_finish)) {
        if ((long)(this_00->pivot_expressions).
                  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this_00->pivot_expressions).
                  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != 8) {
          this_02 = (InternalException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&set,"PIVOT statement with multiple names in pivot entry!?",
                     (allocator *)&groups);
          InternalException::InternalException(this_02,(string *)&set);
          __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        hVar16 = UUID::GenerateRandomUUID();
        input.lower = hVar16.upper;
        input.upper = (int64_t)column;
        BaseUUID::ToString_abi_cxx11_((string *)&groups,(BaseUUID *)hVar16.lower,input);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&set,
                         "__pivot_enum_",(string *)&groups);
        ::std::__cxx11::string::~string((string *)&groups);
        make_uniq<duckdb::SelectNode>();
        pSVar10 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
                  operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                              *)&groups);
        ExtractCTEsRecursive(local_110,&(pSVar10->super_QueryNode).cte_map);
        pTVar11 = unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::
                  operator->((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>
                              *)local_100);
        (*pTVar11->_vptr_TableRef[4])(&local_120,pTVar11);
        pSVar10 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
                  operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                              *)&groups);
        _Var4._M_head_impl = local_120._M_head_impl;
        local_120._M_head_impl = (TableRef *)0x0;
        _Var2._M_head_impl =
             (pSVar10->from_table).
             super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
             super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
             super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
             super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
        (pSVar10->from_table).
        super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
        super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
        super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = _Var4._M_head_impl;
        if (_Var2._M_head_impl != (TableRef *)0x0) {
          (**(code **)((long)(_Var2._M_head_impl)->_vptr_TableRef + 8))();
          if (local_120._M_head_impl != (TableRef *)0x0) {
            (*(local_120._M_head_impl)->_vptr_TableRef[1])();
          }
        }
        ::std::__cxx11::string::string((string *)&local_50,(string *)&set);
        local_c0._M_head_impl =
             (SelectNode *)
             groups.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        groups.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        this_01 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                  ::get<true>(&this_00->pivot_expressions,0);
        pPVar12 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator->(this_01);
        (*(pPVar12->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_c8,pPVar12);
        local_d0._M_head_impl =
             (this_00->subquery).
             super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
             super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
             super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
             super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
        (this_00->subquery).
        super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
        super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
        super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = (QueryNode *)0x0;
        column = &local_c8;
        AddPivotEntry(local_110,&local_50,
                      (unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                       *)&local_c0,
                      (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                       *)column,
                      (unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *
                      )&local_d0,iVar8 < iVar9);
        if (local_d0._M_head_impl != (QueryNode *)0x0) {
          (*(local_d0._M_head_impl)->_vptr_QueryNode[1])();
        }
        local_d0._M_head_impl = (QueryNode *)0x0;
        if (local_c8._M_head_impl != (ParsedExpression *)0x0) {
          (*((local_c8._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
        local_c8._M_head_impl = (ParsedExpression *)0x0;
        if (local_c0._M_head_impl != (SelectNode *)0x0) {
          (*((local_c0._M_head_impl)->super_QueryNode)._vptr_QueryNode[1])();
        }
        local_c0._M_head_impl = (SelectNode *)0x0;
        ::std::__cxx11::string::~string((string *)&local_50);
        ::std::__cxx11::string::_M_assign((string *)&this_00->pivot_enum);
        if (groups.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          (**(code **)(((groups.
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + 8))();
        }
        ::std::__cxx11::string::~string((string *)&set);
      }
    }
    pSVar10 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
              operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                          *)&local_118);
    make_uniq<duckdb::StarExpression>();
    set._M_t._M_impl._0_8_ =
         groups.
         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    groups.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)&pSVar10->select_list,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&set);
    if (set._M_t._M_impl._0_8_ != 0) {
      (**(code **)(*(long *)set._M_t._M_impl._0_8_ + 8))();
    }
    set._M_t._M_impl._0_8_ = 0;
    if (groups.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(((groups.
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + 8))();
    }
    make_uniq<duckdb::PivotRef>();
    pPVar13 = unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>::operator->
                        ((unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>
                          *)&groups);
    auVar6 = local_100;
    local_100 = (undefined1  [8])0x0;
    _Var2._M_head_impl =
         (pPVar13->source).
         super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
         super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
         super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
    (pPVar13->source).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>.
    _M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
    super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = (TableRef *)auVar6;
    if (_Var2._M_head_impl != (TableRef *)0x0) {
      (**(code **)((long)(_Var2._M_head_impl)->_vptr_TableRef + 8))();
    }
    if (pPVar1->unpivots == (PGList *)0x0) {
      pPVar3 = pPVar1->aggrs;
      if (pPVar3 == (PGList *)0x0) {
        set._M_t._M_impl._0_8_ = 0;
        set._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        set._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        make_uniq<duckdb::FunctionExpression,char_const(&)[11],duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
                  ((duckdb *)&local_120,(char (*) [11])"count_star",
                   (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                    *)&set);
        pPVar13 = unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>::
                  operator->((unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>
                              *)&groups);
        local_108._M_head_impl = (ParsedExpression *)local_120._M_head_impl;
        local_120._M_head_impl = (TableRef *)0x0;
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                    *)&pPVar13->aggregates,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)&local_108);
        if ((TableRef *)local_108._M_head_impl != (TableRef *)0x0) {
          (*((local_108._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
        if (local_120._M_head_impl != (TableRef *)0x0) {
          (*(local_120._M_head_impl)->_vptr_TableRef[1])();
        }
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   *)&set);
      }
      else {
        pPVar13 = unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>::
                  operator->((unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>
                              *)&groups);
        TransformExpressionList(local_110,pPVar3,&pPVar13->aggregates);
      }
    }
    else {
      TransformStringList_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  *)&set,local_110,pPVar1->unpivots);
      pPVar13 = unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>::
                operator->((unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>
                            *)&groups);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_move_assign((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&pPVar13->unpivot_names,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&set);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&set);
    }
    if (pPVar1->groups != (PGList *)0x0) {
      TransformStringList_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  *)&set,local_110,pPVar1->groups);
      pPVar13 = unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>::
                operator->((unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>
                            *)&groups);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_move_assign((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&pPVar13->groups,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&set);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&set);
    }
    pPVar13 = unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>::operator->
                        ((unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>
                          *)&groups);
    ::std::vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>::_M_move_assign
              (&(pPVar13->pivots).
                super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>,&columns);
    ref = unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true>::operator*
                    ((unique_ptr<duckdb::PivotRef,_std::default_delete<duckdb::PivotRef>,_true> *)
                     &groups);
    SetQueryLocation(&ref->super_TableRef,pPVar1->location);
    pbVar7 = groups.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    groups.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    pSVar10 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
              operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                          *)&local_118);
    _Var2._M_head_impl =
         (pSVar10->from_table).
         super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
         super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
         super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
    (pSVar10->from_table).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>
    ._M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
    super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = (TableRef *)pbVar7;
    if (_Var2._M_head_impl != (TableRef *)0x0) {
      (**(code **)((long)(_Var2._M_head_impl)->_vptr_TableRef + 8))();
    }
    pSVar15 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
              operator*((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                         *)&local_118);
    TransformModifiers(local_110,in_RDX,&pSVar15->super_QueryNode);
    _Var5._M_head_impl = local_118._M_head_impl;
    local_118._M_head_impl = (SelectNode *)0x0;
    (this->parent).ptr = (Transformer *)_Var5._M_head_impl;
    if (groups.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(((groups.
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + 8))();
    }
    ::std::vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>::~vector
              (&columns.super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>);
    if (local_118._M_head_impl != (SelectNode *)0x0) {
      (*(code *)((Transformer *)((local_118._M_head_impl)->super_QueryNode)._vptr_QueryNode)->
                options)();
    }
  }
  if (local_100 != (undefined1  [8])0x0) {
    (*(code *)((optional_ptr<duckdb::Transformer,_true> *)local_100)->ptr->options)();
  }
  return (unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)
         (unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)this;
}

Assistant:

unique_ptr<QueryNode> Transformer::TransformPivotStatement(duckdb_libpgquery::PGSelectStmt &select) {
	auto pivot = select.pivot;
	auto current_param_count = ParamCount();
	auto source = TransformTableRefNode(*pivot->source);
	auto next_param_count = ParamCount();
	bool has_parameters = next_param_count > current_param_count;

	auto select_node = make_uniq<SelectNode>();
	// handle the CTEs
	if (select.withClause) {
		TransformCTE(*PGPointerCast<duckdb_libpgquery::PGWithClause>(select.withClause), select_node->cte_map);
	}
	if (!pivot->columns) {
		// no pivot columns - not actually a pivot
		select_node->from_table = std::move(source);
		if (pivot->groups) {
			auto groups = TransformStringList(pivot->groups);
			GroupingSet set;
			for (idx_t gr = 0; gr < groups.size(); gr++) {
				auto &group = groups[gr];
				auto colref = make_uniq<ColumnRefExpression>(group);
				select_node->select_list.push_back(colref->Copy());
				select_node->groups.group_expressions.push_back(std::move(colref));
				set.insert(gr);
			}
			select_node->groups.grouping_sets.push_back(std::move(set));
		}
		if (pivot->aggrs) {
			TransformExpressionList(*pivot->aggrs, select_node->select_list);
		}
		// transform order by/limit modifiers
		TransformModifiers(select, *select_node);
		return std::move(select_node);
	}

	// generate CREATE TYPE statements for each of the columns that do not have an IN list
	bool is_pivot = !pivot->unpivots;
	auto columns = TransformPivotList(*pivot->columns, is_pivot);
	for (idx_t c = 0; c < columns.size(); c++) {
		auto &col = columns[c];
		if (!col.pivot_enum.empty() || !col.entries.empty()) {
			continue;
		}
		if (col.pivot_expressions.size() != 1) {
			throw InternalException("PIVOT statement with multiple names in pivot entry!?");
		}
		auto enum_name = "__pivot_enum_" + UUID::ToString(UUID::GenerateRandomUUID());

		auto new_select = make_uniq<SelectNode>();
		ExtractCTEsRecursive(new_select->cte_map);
		new_select->from_table = source->Copy();
		AddPivotEntry(enum_name, std::move(new_select), col.pivot_expressions[0]->Copy(), std::move(col.subquery),
		              has_parameters);
		col.pivot_enum = enum_name;
	}

	// generate the actual query, including the pivot
	select_node->select_list.push_back(make_uniq<StarExpression>());

	auto pivot_ref = make_uniq<PivotRef>();
	pivot_ref->source = std::move(source);
	if (pivot->unpivots) {
		pivot_ref->unpivot_names = TransformStringList(pivot->unpivots);
	} else {
		if (pivot->aggrs) {
			TransformExpressionList(*pivot->aggrs, pivot_ref->aggregates);
		} else {
			// pivot but no aggregates specified - push a count star
			vector<unique_ptr<ParsedExpression>> children;
			auto function = make_uniq<FunctionExpression>("count_star", std::move(children));
			pivot_ref->aggregates.push_back(std::move(function));
		}
	}
	if (pivot->groups) {
		pivot_ref->groups = TransformStringList(pivot->groups);
	}
	pivot_ref->pivots = std::move(columns);
	SetQueryLocation(*pivot_ref, pivot->location);
	select_node->from_table = std::move(pivot_ref);
	// transform order by/limit modifiers
	TransformModifiers(select, *select_node);

	return std::move(select_node);
}